

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>::
AdapterPromiseNode<kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>const&,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>
          (AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *this,
          AsyncPipe *params,ArrayPtr<const_unsigned_char> *params_1,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *params_2)

{
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  ArrayPtr<const_unsigned_char> writeBuffer;
  AsyncPipe *pipe;
  ArrayPtr<const_unsigned_char> *pAVar1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *pAVar2;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_78;
  ArrayPtr<const_unsigned_char> *local_58;
  size_t sStack_50;
  uchar *local_48;
  size_t sStack_40;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *local_28;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *params_local_2;
  ArrayPtr<const_unsigned_char> *params_local_1;
  AsyncPipe *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *this_local;
  
  local_28 = params_2;
  params_local_2 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)params_1;
  params_local_1 = (ArrayPtr<const_unsigned_char> *)params;
  params_local = (AsyncPipe *)this;
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c0ff58;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c0ffa8;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x20));
  this[0x1c0] = (AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>)
                0x1;
  pipe = fwd<kj::(anonymous_namespace)::AsyncPipe&>((AsyncPipe *)params_local_1);
  pAVar1 = fwd<kj::ArrayPtr<unsigned_char_const>const&>
                     ((ArrayPtr<const_unsigned_char> *)params_local_2);
  local_48 = pAVar1->ptr;
  sStack_40 = pAVar1->size_;
  pAVar2 = fwd<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>(local_28);
  local_58 = pAVar2->ptr;
  sStack_50 = pAVar2->size_;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  OneOf(&local_78);
  writeBuffer.size_ = sStack_40;
  writeBuffer.ptr = local_48;
  morePieces.size_ = sStack_50;
  morePieces.ptr = local_58;
  anon_unknown_123::AsyncPipe::BlockedWrite::BlockedWrite
            ((BlockedWrite *)(this + 0x1c8),(PromiseFulfiller<void> *)(this + 0x18),pipe,writeBuffer
             ,morePieces,&local_78);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  ~OneOf(&local_78);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}